

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gim_memory.cpp
# Opt level: O2

void * gim_realloc(void *ptr,size_t oldsize,size_t newsize)

{
  void *__dest;
  
  __dest = gim_alloc(newsize);
  if (oldsize < newsize) {
    newsize = oldsize;
  }
  memcpy(__dest,ptr,newsize);
  gim_free(ptr);
  return __dest;
}

Assistant:

void * gim_realloc(void *ptr, size_t oldsize, size_t newsize)
{
 	void * newptr = gim_alloc(newsize);
    size_t copysize = oldsize<newsize?oldsize:newsize;
    gim_simd_memcpy(newptr,ptr,copysize);
    gim_free(ptr);
    return newptr;
}